

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

bool cmExportCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  pointer *this;
  string_view sVar1;
  pointer ppVar2;
  cmExecutionStatus *pcVar3;
  bool bVar4;
  TargetType TVar5;
  PolicyStatus PVar6;
  size_type sVar7;
  const_reference pvVar8;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *pcVar9;
  cmArgumentParser<Arguments> *pcVar10;
  reference pvVar11;
  cmExportSetMap *this_00;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::PackageDependencyArguments>
  *this_01;
  cmArgumentParser<PackageDependencyArguments> *pcVar12;
  PackageDependency *pPVar13;
  cmArgumentParser<TargetArguments> *pcVar14;
  ulong uVar15;
  cmMakefile *pcVar16;
  cmGlobalGenerator *pcVar17;
  pointer ppVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  reference name;
  ostream *poVar19;
  cmExportBuildFileGenerator *pcVar20;
  pointer pcVar21;
  char *mainFile;
  PolicyID id;
  static_string_view sVar22;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar23;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
  local_11b8;
  string *local_11b0;
  string *ct;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
  local_1158;
  unique_ptr<cmExportBuildAndroidMKGenerator,_std::default_delete<cmExportBuildAndroidMKGenerator>_>
  local_1150;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
  local_1148;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> ebfg;
  char local_1119;
  string local_1118;
  string local_10f8;
  allocator<char> local_10d1;
  string local_10d0;
  cmExportBuildFileGenerator *local_10b0;
  cmExportBuildFileGenerator *ebfg_1;
  string local_1088;
  undefined1 local_1068 [8];
  ostringstream e_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  cmTarget *local_eb0;
  cmTarget *target;
  undefined1 local_e88 [8];
  ostringstream e_3;
  string *currentTarget;
  const_iterator __end3;
  const_iterator __begin3;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  undefined1 local_cd0 [8];
  ostringstream e_2;
  _Self local_b58;
  _Self local_b50;
  iterator it;
  cmExportSetMap *setMap_1;
  cmExportSet *exportSet;
  cmGlobalGenerator *gg;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  string *local_ad8;
  string *dir;
  undefined1 local_ab0 [8];
  ostringstream e_1;
  cmMakefile *mf;
  undefined1 local_910 [8];
  ostringstream e;
  string local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  allocator<char> local_751;
  string local_750;
  byte local_729;
  undefined1 local_728 [7];
  bool android;
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_6c8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_6b8;
  undefined1 local_6a8 [8];
  TargetArguments targetArguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targetArgs;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2_1;
  cmArgumentParser<TargetArguments> local_658;
  undefined1 local_5e8 [8];
  cmArgumentParser<TargetArguments> targetParser;
  PackageDependency *packageDependency;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_4f0;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_4e0;
  undefined1 local_4d0 [8];
  PackageDependencyArguments packageDependencyArguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *packageDependencyArgs;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2;
  cmArgumentParser<PackageDependencyArguments> local_458;
  undefined1 local_3e8 [8];
  cmArgumentParser<PackageDependencyArguments> packageDependencyParser;
  cmExportSet *exportSet_1;
  cmExportSetMap *setMap;
  cmGlobalGenerator *gg_1;
  cmMakefile *mf_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  undefined1 local_310 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  cmArgumentParser<Arguments> local_138;
  undefined1 local_c8 [8];
  cmArgumentParser<Arguments> parser;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar3 = local_20;
  if (sVar7 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with too few arguments",&local_41);
    cmExecutionStatus::SetError(pcVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_00438b6d;
  }
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  bVar4 = std::operator==(pvVar8,"PACKAGE");
  if (bVar4) {
    args_local._7_1_ =
         HandlePackage((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local,local_20);
    goto LAB_00438b6d;
  }
  local_138.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
  local_138.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
  local_138.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
  local_138.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
  local_138.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_138.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
  local_138.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_138.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_138.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmArgumentParser<Arguments>::cmArgumentParser(&local_138);
  sVar22 = cm::operator____s("NAMESPACE",9);
  pcVar9 = (cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
            *)cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              ::Bind<std::__cxx11::string>
                        ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                          *)&local_138,sVar22,0x40);
  sVar22 = cm::operator____s("FILE",4);
  pcVar9 = (cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
            *)cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              ::Bind<std::__cxx11::string>(pcVar9,sVar22,0x60);
  sVar22 = cm::operator____s("CXX_MODULES_DIRECTORY",0x15);
  pcVar10 = cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
            ::Bind<std::__cxx11::string>(pcVar9,sVar22,0xa0);
  cmArgumentParser<Arguments>::cmArgumentParser((cmArgumentParser<Arguments> *)local_c8,pcVar10);
  cmArgumentParser<Arguments>::~cmArgumentParser(&local_138);
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  bVar4 = std::operator==(pvVar8,"EXPORT");
  if (bVar4) {
    sVar22 = cm::operator____s("EXPORT",6);
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_c8,sVar22,0);
    pcVar16 = cmExecutionStatus::GetMakefile(local_20);
    bVar4 = cmExperimental::HasSupportEnabled(pcVar16,ExportPackageDependencies);
    if (bVar4) {
      sVar22 = cm::operator____s("EXPORT_PACKAGE_DEPENDENCIES",0x1b);
      cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_c8,sVar22,0xe0);
    }
  }
  else {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    bVar4 = std::operator==(pvVar8,"SETUP");
    if (bVar4) {
      sVar22 = cm::operator____s("SETUP",5);
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_c8,sVar22,0);
      pcVar16 = cmExecutionStatus::GetMakefile(local_20);
      bVar4 = cmExperimental::HasSupportEnabled(pcVar16,ExportPackageDependencies);
      if (bVar4) {
        sVar22 = cm::operator____s("PACKAGE_DEPENDENCY",0x12);
        cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
        ::
        Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                    *)local_c8,sVar22,200);
      }
      sVar22 = cm::operator____s("TARGET",6);
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_c8,sVar22,0xe8);
    }
    else {
      sVar22 = cm::operator____s("TARGETS",7);
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_c8,sVar22,0x20);
      sVar22 = cm::operator____s("ANDROID_MK",10);
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_c8,sVar22,0x80);
      sVar22 = cm::operator____s("APPEND",6);
      cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_c8,sVar22,0xc0);
      sVar22 = cm::operator____s("EXPORT_LINK_INTERFACE_LIBRARIES",0x1f);
      cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_c8,sVar22,0xc1);
    }
  }
  this = &arguments.TargetArgs.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Arguments *)local_310,
             (cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)local_c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)status_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this,0);
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&arguments.TargetArgs.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar3 = local_20;
  if (bVar4) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    bVar4 = std::operator==(pvVar8,"SETUP");
    if (bVar4) {
      pcVar16 = cmExecutionStatus::GetMakefile(local_20);
      pcVar17 = cmMakefile::GetGlobalGenerator(pcVar16);
      this_00 = cmGlobalGenerator::GetExportSets(pcVar17);
      packageDependencyParser.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cmExportSetMap::operator[](this_00,(string *)local_310);
      local_458.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_458.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_458.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
      local_458.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
      local_458.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_458.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
      local_458.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      local_458.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
      local_458.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_458.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_458.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      local_458.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cmArgumentParser<PackageDependencyArguments>::cmArgumentParser(&local_458);
      sVar22 = cm::operator____s("ENABLED",7);
      this_01 = (cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::PackageDependencyArguments>
                 *)cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::PackageDependencyArguments>
                   ::Bind<std::__cxx11::string>
                             ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::PackageDependencyArguments>
                               *)&local_458,sVar22,0);
      sVar22 = cm::operator____s("EXTRA_ARGS",10);
      pcVar12 = cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::PackageDependencyArguments>
                ::
                Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (this_01,sVar22,0x20);
      cmArgumentParser<PackageDependencyArguments>::cmArgumentParser
                ((cmArgumentParser<PackageDependencyArguments> *)local_3e8,pcVar12);
      cmArgumentParser<PackageDependencyArguments>::~cmArgumentParser(&local_458);
      __end2 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::begin((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&arguments.Append);
      packageDependencyArgs =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::end((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&arguments.Append);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                    *)&packageDependencyArgs);
        if (!bVar4) break;
        packageDependencyArguments.ExtraArgs.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator*(&__end2);
        bVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)packageDependencyArguments.ExtraArgs.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar4) {
          cVar23 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)packageDependencyArguments.ExtraArgs.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_4f0 = cVar23;
          cVar23 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::advance(&local_4f0,1);
          local_4e0 = cVar23;
          cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::PackageDependencyArguments>
          ::
          Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ((PackageDependencyArguments *)local_4d0,
                     (cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::PackageDependencyArguments>
                      *)local_3e8,&local_4e0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&arguments.TargetArgs.
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          bVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&arguments.TargetArgs.
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pcVar3 = local_20;
          ppVar2 = packageDependencyParser.super_Base.Bindings.Positions.
                   super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                   .
                   super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (bVar4) {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)packageDependencyArguments.ExtraArgs.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pPVar13 = cmExportSet::GetPackageDependencyForSetup((cmExportSet *)ppVar2,pvVar8);
            uVar15 = std::__cxx11::string::empty();
            if ((uVar15 & 1) == 0) {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_4d0,"AUTO");
              if (bVar4) {
                pPVar13->Enabled = Auto;
              }
              else {
                sVar1 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)local_4d0);
                bVar4 = cmIsOff(sVar1);
                if (bVar4) {
                  pPVar13->Enabled = Off;
                }
                else {
                  sVar1 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_4d0);
                  bVar4 = cmIsOn(sVar1);
                  pcVar3 = local_20;
                  if (!bVar4) {
                    cmStrCat<char_const(&)[49],std::__cxx11::string_const&,char_const(&)[2]>
                              ((string *)
                               ((long)&targetParser.super_Base.Bindings.Positions.
                                       super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                       .
                                       super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                       ._M_impl + 0x10),
                               (char (*) [49])"Invalid enable setting for package dependency: \"",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4d0,(char (*) [2])0x1031a6f);
                    cmExecutionStatus::SetError
                              (pcVar3,(string *)
                                      ((long)&targetParser.super_Base.Bindings.Positions.
                                              super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                              .
                                              super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                              ._M_impl + 0x10));
                    std::__cxx11::string::~string
                              ((string *)
                               ((long)&targetParser.super_Base.Bindings.Positions.
                                       super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                       .
                                       super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                       ._M_impl + 0x10));
                    args_local._7_1_ = 0;
                    bVar4 = true;
                    goto LAB_0043751f;
                  }
                  pPVar13->Enabled = On;
                }
              }
            }
            cm::
            append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                      (&pPVar13->ExtraArguments,
                       (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&packageDependencyArguments.Enabled.field_2 + 8));
            bVar4 = false;
          }
          else {
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&arguments.TargetArgs.
                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &packageDependency,"Unknown argument: \"",pvVar11);
            std::operator+(&local_510,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &packageDependency,"\".");
            cmExecutionStatus::SetError(pcVar3,&local_510);
            std::__cxx11::string::~string((string *)&local_510);
            std::__cxx11::string::~string((string *)&packageDependency);
            args_local._7_1_ = 0;
            bVar4 = true;
          }
LAB_0043751f:
          cmExportCommand::PackageDependencyArguments::~PackageDependencyArguments
                    ((PackageDependencyArguments *)local_4d0);
          if (bVar4) goto LAB_004378f2;
        }
        __gnu_cxx::
        __normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator++(&__end2);
      }
      local_658.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_658.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_658.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
      local_658.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_658.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
      local_658.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_658.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
      local_658.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      local_658.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
      local_658.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_658.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_658.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      local_658.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_658.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cmArgumentParser<TargetArguments>::cmArgumentParser(&local_658);
      sVar22 = cm::operator____s("XCFRAMEWORK_LOCATION",0x14);
      pcVar14 = cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::TargetArguments>
                ::Bind<std::__cxx11::string>
                          ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::TargetArguments>
                            *)&local_658,sVar22,0);
      cmArgumentParser<TargetArguments>::cmArgumentParser
                ((cmArgumentParser<TargetArguments> *)local_5e8,pcVar14);
      cmArgumentParser<TargetArguments>::~cmArgumentParser(&local_658);
      __end2_1 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::begin((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&arguments.ExportPackageDependencies);
      targetArgs = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)std::
                      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::end((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&arguments.ExportPackageDependencies);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)&targetArgs);
        if (!bVar4) break;
        targetArguments.XcFrameworkLocation.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator*(&__end2_1);
        bVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)targetArguments.XcFrameworkLocation.field_2._8_8_);
        if (!bVar4) {
          cVar23 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)targetArguments.XcFrameworkLocation.field_2._8_8_);
          local_6c8 = cVar23;
          cVar23 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::advance(&local_6c8,1);
          local_6b8 = cVar23;
          cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::TargetArguments>
          ::
          Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ((TargetArguments *)local_6a8,
                     (cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::TargetArguments>
                      *)local_5e8,&local_6b8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&arguments.TargetArgs.
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          bVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&arguments.TargetArgs.
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pcVar3 = local_20;
          ppVar2 = packageDependencyParser.super_Base.Bindings.Positions.
                   super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                   .
                   super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (bVar4) {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)targetArguments.XcFrameworkLocation.field_2._8_8_);
            cmExportSet::SetXcFrameworkLocation((cmExportSet *)ppVar2,pvVar8,(string *)local_6a8);
          }
          else {
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&arguments.TargetArgs.
                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&fname.field_2 + 8),"Unknown argument: \"",pvVar11);
            std::operator+(&local_6e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&fname.field_2 + 8),"\".");
            cmExecutionStatus::SetError(pcVar3,&local_6e8);
            std::__cxx11::string::~string((string *)&local_6e8);
            std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
            args_local._7_1_ = 0;
          }
          cmExportCommand::TargetArguments::~TargetArguments((TargetArguments *)local_6a8);
          if (!bVar4) goto LAB_004378d6;
        }
        __gnu_cxx::
        __normal_iterator<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator++(&__end2_1);
      }
      args_local._7_1_ = 1;
LAB_004378d6:
      cmArgumentParser<TargetArguments>::~cmArgumentParser
                ((cmArgumentParser<TargetArguments> *)local_5e8);
LAB_004378f2:
      cmArgumentParser<PackageDependencyArguments>::~cmArgumentParser
                ((cmArgumentParser<PackageDependencyArguments> *)local_3e8);
    }
    else {
      std::__cxx11::string::string((string *)local_728);
      local_729 = 0;
      uVar15 = std::__cxx11::string::empty();
      if ((uVar15 & 1) == 0) {
        std::__cxx11::string::operator=
                  ((string *)local_728,(string *)(arguments.Filename.field_2._M_local_buf + 8));
        local_729 = 1;
      }
      uVar15 = std::__cxx11::string::empty();
      if (((uVar15 & 1) == 0) || (uVar15 = std::__cxx11::string::empty(), (uVar15 & 1) == 0)) {
        uVar15 = std::__cxx11::string::empty();
        if ((uVar15 & 1) != 0) {
          cmsys::SystemTools::GetFilenameLastExtension
                    (&local_798,(string *)((long)&arguments.Namespace.field_2 + 8));
          bVar4 = std::operator!=(&local_798,".cmake");
          std::__cxx11::string::~string((string *)&local_798);
          if (bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_910);
            poVar19 = std::operator<<((ostream *)local_910,"FILE option given filename \"");
            poVar19 = std::operator<<(poVar19,(string *)
                                              (arguments.Namespace.field_2._M_local_buf + 8));
            std::operator<<(poVar19,"\" which does not have an extension of \".cmake\".\n");
            pcVar3 = local_20;
            std::__cxx11::ostringstream::str();
            cmExecutionStatus::SetError(pcVar3,(string *)&mf);
            std::__cxx11::string::~string((string *)&mf);
            args_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_910);
            goto LAB_00438b05;
          }
          std::__cxx11::string::operator=
                    ((string *)local_728,(string *)(arguments.Namespace.field_2._M_local_buf + 8));
        }
LAB_00437c47:
        pcVar16 = cmExecutionStatus::GetMakefile(local_20);
        bVar4 = cmsys::SystemTools::FileIsFullPath((string *)local_728);
        if (bVar4) {
          bVar4 = cmMakefile::CanIWriteThisFile(pcVar16,(string *)local_728);
          if (!bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ab0);
            poVar19 = std::operator<<((ostream *)local_ab0,"FILE option given filename \"");
            poVar19 = std::operator<<(poVar19,(string *)local_728);
            std::operator<<(poVar19,"\" which is in the source tree.\n");
            pcVar3 = local_20;
            std::__cxx11::ostringstream::str();
            cmExecutionStatus::SetError(pcVar3,(string *)&dir);
            std::__cxx11::string::~string((string *)&dir);
            args_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ab0);
            goto LAB_00438b05;
          }
        }
        else {
          local_ad8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar16);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets.
                          super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,local_ad8,"/");
          std::operator+(&local_af8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets.
                          super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_728);
          std::__cxx11::string::operator=((string *)local_728,(string *)&local_af8);
          std::__cxx11::string::~string((string *)&local_af8);
          std::__cxx11::string::~string
                    ((string *)
                     &targets.
                      super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::
        vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
        ::vector((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                  *)&gg);
        pcVar17 = cmMakefile::GetGlobalGenerator(pcVar16);
        setMap_1 = (cmExportSetMap *)0x0;
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,0);
        bVar4 = std::operator==(pvVar8,"EXPORT");
        if (bVar4) {
          it._M_node = (_Base_ptr)cmGlobalGenerator::GetExportSets(pcVar17);
          local_b50._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                       *)it._M_node,(key_type *)local_310);
          local_b58._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
               ::end(it._M_node);
          bVar4 = std::operator==(&local_b50,&local_b58);
          if (bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cd0);
            poVar19 = std::operator<<((ostream *)local_cd0,"Export set \"");
            poVar19 = std::operator<<(poVar19,(string *)local_310);
            std::operator<<(poVar19,"\" not found.");
            pcVar3 = local_20;
            std::__cxx11::ostringstream::str();
            cmExecutionStatus::SetError(pcVar3,(string *)&__range3);
            std::__cxx11::string::~string((string *)&__range3);
            args_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cd0);
          }
          else {
            ppVar18 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>
                      ::operator->(&local_b50);
            setMap_1 = (cmExportSetMap *)&ppVar18->second;
LAB_0043859e:
            pcVar20 = cmGlobalGenerator::GetExportedTargetsFile(pcVar17,(string *)local_728);
            if ((pcVar20 != (cmExportBuildFileGenerator *)0x0) &&
               (PVar6 = cmMakefile::GetPolicyStatus(pcVar16,CMP0103,false), pcVar3 = local_20,
               PVar6 != OLD)) {
              if (PVar6 != WARN) {
                cmStrCat<char_const(&)[42],std::__cxx11::string_const&,char_const(&)[32]>
                          ((string *)&ebfg,(char (*) [42])0x1006d1d,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&arguments.Namespace.field_2 + 8),
                           (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
                cmExecutionStatus::SetError(pcVar3,(string *)&ebfg);
                std::__cxx11::string::~string((string *)&ebfg);
                args_local._7_1_ = 0;
                goto LAB_00438ae9;
              }
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1118,(cmPolicies *)0x67,id);
              local_1119 = '\n';
              cmStrCat<std::__cxx11::string,char,char_const(&)[51],std::__cxx11::string_const&,char_const(&)[32]>
                        (&local_10f8,&local_1118,&local_1119,
                         (char (*) [51])"export() command already specified for the file\n  ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&arguments.Namespace.field_2 + 8),
                         (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
              cmMakefile::IssueMessage(pcVar16,AUTHOR_WARNING,&local_10f8);
              std::__cxx11::string::~string((string *)&local_10f8);
              std::__cxx11::string::~string((string *)&local_1118);
            }
            std::
            unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>::
            unique_ptr<std::default_delete<cmExportBuildFileGenerator>,void>
                      ((unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>
                        *)&local_1148,(nullptr_t)0x0);
            if ((local_729 & 1) == 0) {
              std::make_unique<cmExportBuildFileGenerator>();
              std::
              unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
              ::operator=(&local_1148,&local_1158);
              std::
              unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
              ::~unique_ptr(&local_1158);
            }
            else {
              std::make_unique<cmExportBuildAndroidMKGenerator>();
              std::
              unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>
              ::operator=((unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>
                           *)&local_1148,&local_1150);
              std::
              unique_ptr<cmExportBuildAndroidMKGenerator,_std::default_delete<cmExportBuildAndroidMKGenerator>_>
              ::~unique_ptr(&local_1150);
            }
            pcVar21 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::operator->(&local_1148);
            mainFile = (char *)std::__cxx11::string::c_str();
            cmExportFileGenerator::SetExportFile(&pcVar21->super_cmExportFileGenerator,mainFile);
            pcVar21 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::operator->(&local_1148);
            cmExportFileGenerator::SetNamespace
                      (&pcVar21->super_cmExportFileGenerator,
                       (string *)
                       &arguments.Targets.
                        super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_engaged);
            pcVar21 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::operator->(&local_1148);
            std::__cxx11::string::string
                      ((string *)
                       &configurationTypes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)(arguments.AndroidMKFile.field_2._M_local_buf + 8));
            cmExportBuildFileGenerator::SetCxxModuleDirectory
                      (pcVar21,(string *)
                               &configurationTypes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &configurationTypes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pcVar21 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::operator->(&local_1148);
            cmExportBuildFileGenerator::SetAppendMode
                      (pcVar21,(bool)(arguments.CxxModulesDirectory.field_2._M_local_buf[8] & 1));
            if (setMap_1 == (cmExportSetMap *)0x0) {
              pcVar21 = std::
                        unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                        ::operator->(&local_1148);
              cmExportBuildFileGenerator::SetTargets
                        (pcVar21,(vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                                  *)&gg);
            }
            else {
              pcVar21 = std::
                        unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                        ::operator->(&local_1148);
              cmExportBuildFileGenerator::SetExportSet(pcVar21,(cmExportSet *)setMap_1);
            }
            pcVar21 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::operator->(&local_1148);
            cmExportFileGenerator::SetExportOld
                      (&pcVar21->super_cmExportFileGenerator,
                       (bool)(arguments.CxxModulesDirectory.field_2._M_local_buf[9] & 1));
            pcVar21 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::operator->(&local_1148);
            cmExportFileGenerator::SetExportPackageDependencies
                      (&pcVar21->super_cmExportFileGenerator,
                       (bool)((byte)arguments.PackageDependencyArgs.
                                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage & 1));
            cmMakefile::GetGeneratorConfigs_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1,pcVar16,IncludeEmptyConfig);
            __end1 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range1);
            ct = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1);
            while (bVar4 = __gnu_cxx::operator!=
                                     (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&ct), bVar4) {
              local_11b0 = __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&__end1);
              pcVar21 = std::
                        unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                        ::operator->(&local_1148);
              cmExportFileGenerator::AddConfiguration
                        (&pcVar21->super_cmExportFileGenerator,local_11b0);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end1);
            }
            if (setMap_1 == (cmExportSetMap *)0x0) {
              pcVar21 = std::
                        unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                        ::get(&local_1148);
              cmGlobalGenerator::AddBuildExportSet(pcVar17,pcVar21);
            }
            else {
              pcVar21 = std::
                        unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                        ::get(&local_1148);
              cmGlobalGenerator::AddBuildExportExportSet(pcVar17,pcVar21);
            }
            std::
            unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
            ::unique_ptr(&local_11b8,&local_1148);
            cmMakefile::AddExportBuildFileGenerator(pcVar16,&local_11b8);
            std::
            unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
            ::~unique_ptr(&local_11b8);
            args_local._7_1_ = 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
            std::
            unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
            ::~unique_ptr(&local_1148);
          }
        }
        else {
          bVar4 = std::optional::operator_cast_to_bool
                            ((optional *)(arguments.ExportSetName.field_2._M_local_buf + 8));
          pcVar3 = local_20;
          if (bVar4) {
            this_02 = &std::
                       optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator*((optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)((long)&arguments.ExportSetName.field_2 + 8))->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ;
            __end3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(this_02);
            currentTarget =
                 (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(this_02);
            while (bVar4 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&currentTarget), bVar4) {
              name = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end3);
              bVar4 = cmMakefile::IsAlias(pcVar16,name);
              if (bVar4) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e88);
                poVar19 = std::operator<<((ostream *)local_e88,"given ALIAS target \"");
                poVar19 = std::operator<<(poVar19,(string *)name);
                std::operator<<(poVar19,"\" which may not be exported.");
                pcVar3 = local_20;
                std::__cxx11::ostringstream::str();
                cmExecutionStatus::SetError(pcVar3,(string *)&target);
                std::__cxx11::string::~string((string *)&target);
                args_local._7_1_ = 0;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e88);
                goto LAB_00438ae9;
              }
              local_eb0 = cmGlobalGenerator::FindTarget(pcVar17,name,false);
              if (local_eb0 == (cmTarget *)0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1068);
                poVar19 = std::operator<<((ostream *)local_1068,"given target \"");
                poVar19 = std::operator<<(poVar19,(string *)name);
                std::operator<<(poVar19,"\" which is not built by this project.");
                pcVar3 = local_20;
                std::__cxx11::ostringstream::str();
                cmExecutionStatus::SetError(pcVar3,&local_1088);
                std::__cxx11::string::~string((string *)&local_1088);
                args_local._7_1_ = 0;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1068);
                goto LAB_00438ae9;
              }
              TVar5 = cmTarget::GetType(local_eb0);
              pcVar3 = local_20;
              if (TVar5 == UTILITY) {
                std::operator+(&local_ef0,"given custom target \"",name);
                std::operator+(&local_ed0,&local_ef0,"\" which may not be exported.");
                cmExecutionStatus::SetError(pcVar3,&local_ed0);
                std::__cxx11::string::~string((string *)&local_ed0);
                std::__cxx11::string::~string((string *)&local_ef0);
                args_local._7_1_ = 0;
                goto LAB_00438ae9;
              }
              std::__cxx11::string::string((string *)&ebfg_1);
              std::
              vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
              ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string>
                        ((vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
                          *)&gg,name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &ebfg_1);
              std::__cxx11::string::~string((string *)&ebfg_1);
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end3);
            }
            if (((arguments.CxxModulesDirectory.field_2._M_local_buf[8] & 1U) == 0) ||
               (local_10b0 = cmGlobalGenerator::GetExportedTargetsFile(pcVar17,(string *)local_728),
               local_10b0 == (cmExportBuildFileGenerator *)0x0)) goto LAB_0043859e;
            cmExportBuildFileGenerator::AppendTargets
                      (local_10b0,
                       (vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                        *)&gg);
            args_local._7_1_ = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_10d0,"EXPORT or TARGETS specifier missing.",&local_10d1);
            cmExecutionStatus::SetError(pcVar3,&local_10d0);
            std::__cxx11::string::~string((string *)&local_10d0);
            std::allocator<char>::~allocator(&local_10d1);
            args_local._7_1_ = 0;
          }
        }
LAB_00438ae9:
        std::
        vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
        ::~vector((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                   *)&gg);
      }
      else {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,0);
        bVar4 = std::operator!=(pvVar8,"EXPORT");
        pcVar3 = local_20;
        if (!bVar4) {
          std::operator+(&local_778,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_310,".cmake");
          std::__cxx11::string::operator=((string *)local_728,(string *)&local_778);
          std::__cxx11::string::~string((string *)&local_778);
          goto LAB_00437c47;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_750,"FILE <filename> option missing.",&local_751);
        cmExecutionStatus::SetError(pcVar3,&local_750);
        std::__cxx11::string::~string((string *)&local_750);
        std::allocator<char>::~allocator(&local_751);
        args_local._7_1_ = 0;
      }
LAB_00438b05:
      std::__cxx11::string::~string((string *)local_728);
    }
  }
  else {
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&arguments.TargetArgs.
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_350,"Unknown argument: \"",pvVar11);
    std::operator+(&local_330,&local_350,"\".");
    cmExecutionStatus::SetError(pcVar3,&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    args_local._7_1_ = 0;
  }
  cmExportCommand::Arguments::~Arguments((Arguments *)local_310);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&arguments.TargetArgs.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmArgumentParser<Arguments>::~cmArgumentParser((cmArgumentParser<Arguments> *)local_c8);
LAB_00438b6d:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmExportCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return HandlePackage(args, status);
  }

  struct Arguments
  {
    std::string ExportSetName;
    cm::optional<ArgumentParser::MaybeEmpty<std::vector<std::string>>> Targets;
    std::string Namespace;
    std::string Filename;
    std::string AndroidMKFile;
    std::string CxxModulesDirectory;
    bool Append = false;
    bool ExportOld = false;

    std::vector<std::vector<std::string>> PackageDependencyArgs;
    bool ExportPackageDependencies = false;

    std::vector<std::vector<std::string>> TargetArgs;
  };

  auto parser =
    cmArgumentParser<Arguments>{}
      .Bind("NAMESPACE"_s, &Arguments::Namespace)
      .Bind("FILE"_s, &Arguments::Filename)
      .Bind("CXX_MODULES_DIRECTORY"_s, &Arguments::CxxModulesDirectory);

  if (args[0] == "EXPORT") {
    parser.Bind("EXPORT"_s, &Arguments::ExportSetName);
    if (cmExperimental::HasSupportEnabled(
          status.GetMakefile(),
          cmExperimental::Feature::ExportPackageDependencies)) {
      parser.Bind("EXPORT_PACKAGE_DEPENDENCIES"_s,
                  &Arguments::ExportPackageDependencies);
    }
  } else if (args[0] == "SETUP") {
    parser.Bind("SETUP"_s, &Arguments::ExportSetName);
    if (cmExperimental::HasSupportEnabled(
          status.GetMakefile(),
          cmExperimental::Feature::ExportPackageDependencies)) {
      parser.Bind("PACKAGE_DEPENDENCY"_s, &Arguments::PackageDependencyArgs);
    }
    parser.Bind("TARGET"_s, &Arguments::TargetArgs);
  } else {
    parser.Bind("TARGETS"_s, &Arguments::Targets);
    parser.Bind("ANDROID_MK"_s, &Arguments::AndroidMKFile);
    parser.Bind("APPEND"_s, &Arguments::Append);
    parser.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, &Arguments::ExportOld);
  }

  std::vector<std::string> unknownArgs;
  Arguments const arguments = parser.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
    return false;
  }

  if (args[0] == "SETUP") {
    cmMakefile& mf = status.GetMakefile();
    cmGlobalGenerator* gg = mf.GetGlobalGenerator();

    cmExportSetMap& setMap = gg->GetExportSets();
    auto& exportSet = setMap[arguments.ExportSetName];

    struct PackageDependencyArguments
    {
      std::string Enabled;
      ArgumentParser::MaybeEmpty<std::vector<std::string>> ExtraArgs;
    };

    auto packageDependencyParser =
      cmArgumentParser<PackageDependencyArguments>{}
        .Bind("ENABLED"_s, &PackageDependencyArguments::Enabled)
        .Bind("EXTRA_ARGS"_s, &PackageDependencyArguments::ExtraArgs);

    for (auto const& packageDependencyArgs : arguments.PackageDependencyArgs) {
      if (packageDependencyArgs.empty()) {
        continue;
      }

      PackageDependencyArguments const packageDependencyArguments =
        packageDependencyParser.Parse(
          cmMakeRange(packageDependencyArgs).advance(1), &unknownArgs);

      if (!unknownArgs.empty()) {
        status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
        return false;
      }

      auto& packageDependency =
        exportSet.GetPackageDependencyForSetup(packageDependencyArgs.front());

      if (!packageDependencyArguments.Enabled.empty()) {
        if (packageDependencyArguments.Enabled == "AUTO") {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::Auto;
        } else if (cmIsOff(packageDependencyArguments.Enabled)) {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::Off;
        } else if (cmIsOn(packageDependencyArguments.Enabled)) {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::On;
        } else {
          status.SetError(
            cmStrCat("Invalid enable setting for package dependency: \"",
                     packageDependencyArguments.Enabled, "\""));
          return false;
        }
      }

      cm::append(packageDependency.ExtraArguments,
                 packageDependencyArguments.ExtraArgs);
    }

    struct TargetArguments
    {
      std::string XcFrameworkLocation;
    };

    auto targetParser = cmArgumentParser<TargetArguments>{}.Bind(
      "XCFRAMEWORK_LOCATION"_s, &TargetArguments::XcFrameworkLocation);

    for (auto const& targetArgs : arguments.TargetArgs) {
      if (targetArgs.empty()) {
        continue;
      }

      TargetArguments const targetArguments =
        targetParser.Parse(cmMakeRange(targetArgs).advance(1), &unknownArgs);

      if (!unknownArgs.empty()) {
        status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
        return false;
      }

      exportSet.SetXcFrameworkLocation(targetArgs.front(),
                                       targetArguments.XcFrameworkLocation);
    }

    return true;
  }

  std::string fname;
  bool android = false;
  if (!arguments.AndroidMKFile.empty()) {
    fname = arguments.AndroidMKFile;
    android = true;
  }
  if (arguments.Filename.empty() && fname.empty()) {
    if (args[0] != "EXPORT") {
      status.SetError("FILE <filename> option missing.");
      return false;
    }
    fname = arguments.ExportSetName + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(arguments.Filename) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << arguments.Filename
        << "\" which does not have an extension of \".cmake\".\n";
      status.SetError(e.str());
      return false;
    }
    fname = arguments.Filename;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!mf.CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      status.SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string const& dir = mf.GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<cmExportBuildFileGenerator::TargetExport> targets;

  cmGlobalGenerator* gg = mf.GetGlobalGenerator();

  cmExportSet* exportSet = nullptr;
  if (args[0] == "EXPORT") {
    cmExportSetMap& setMap = gg->GetExportSets();
    auto const it = setMap.find(arguments.ExportSetName);
    if (it == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << arguments.ExportSetName << "\" not found.";
      status.SetError(e.str());
      return false;
    }
    exportSet = &it->second;
  } else if (arguments.Targets) {
    for (std::string const& currentTarget : *arguments.Targets) {
      if (mf.IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        status.SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          status.SetError("given custom target \"" + currentTarget +
                          "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        status.SetError(e.str());
        return false;
      }
      targets.emplace_back(currentTarget, std::string{});
    }
    if (arguments.Append) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    status.SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // if cmExportBuildFileGenerator is already defined for the file
  // and APPEND is not specified, if CMP0103 is OLD ignore previous definition
  // else raise an error
  if (gg->GetExportedTargetsFile(fname) != nullptr) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0103)) {
      case cmPolicies::WARN:
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0103), '\n',
                   "export() command already specified for the file\n  ",
                   arguments.Filename, "\nDid you miss 'APPEND' keyword?"));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      default:
        status.SetError(cmStrCat("command already specified for the file\n  ",
                                 arguments.Filename,
                                 "\nDid you miss 'APPEND' keyword?"));
        return false;
    }
  }

  // Setup export file generation.
  std::unique_ptr<cmExportBuildFileGenerator> ebfg = nullptr;
  if (android) {
    ebfg = cm::make_unique<cmExportBuildAndroidMKGenerator>();
  } else {
    ebfg = cm::make_unique<cmExportBuildFileGenerator>();
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(arguments.Namespace);
  ebfg->SetCxxModuleDirectory(arguments.CxxModulesDirectory);
  ebfg->SetAppendMode(arguments.Append);
  if (exportSet != nullptr) {
    ebfg->SetExportSet(exportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  ebfg->SetExportOld(arguments.ExportOld);
  ebfg->SetExportPackageDependencies(arguments.ExportPackageDependencies);

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes =
    mf.GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (exportSet != nullptr) {
    gg->AddBuildExportExportSet(ebfg.get());
  } else {
    gg->AddBuildExportSet(ebfg.get());
  }
  mf.AddExportBuildFileGenerator(std::move(ebfg));

  return true;
}